

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O2

string * __thiscall
CppGenerator::genTestFunction_abi_cxx11_(string *__return_storage_ptr__,CppGenerator *this)

{
  size_t sVar1;
  View *pVVar2;
  Attribute *pAVar3;
  ulong uVar4;
  ulong local_2f8;
  string fields;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  string local_230;
  string local_210;
  string local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  offset_abi_cxx11_(&local_1f0,this,1);
  std::operator+(&local_1d0,"#ifdef TESTING\n",&local_1f0);
  std::operator+(&local_2d0,&local_1d0,"void ouputViewsForTesting()\n");
  offset_abi_cxx11_(&local_210,this,1);
  std::operator+(&local_2b0,&local_2d0,&local_210);
  std::operator+(&local_250,&local_2b0,"{\n");
  offset_abi_cxx11_(&local_1b0,this,2);
  std::operator+(&local_290,&local_250,&local_1b0);
  std::operator+(&local_270,&local_290,"std::ofstream ofs(\"test.out\");\n");
  offset_abi_cxx11_(&local_230,this,2);
  std::operator+(&fields,&local_270,&local_230);
  std::operator+(__return_storage_ptr__,&fields,"ofs << std::fixed << std::setprecision(2);\n");
  std::__cxx11::string::~string((string *)&fields);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  local_2f8 = 0;
  while( true ) {
    sVar1 = QueryCompiler::numberOfViews
                      ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    if (sVar1 <= local_2f8) break;
    pVVar2 = QueryCompiler::getView
                       ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,local_2f8);
    if (pVVar2->_origin == pVVar2->_destination) {
      std::__cxx11::string::string((string *)&fields,"",(allocator *)&local_270);
      for (uVar4 = 0; uVar4 != 100; uVar4 = uVar4 + 1) {
        if (((pVVar2->_fVars).super__Base_bitset<2UL>._M_w[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0)
        {
          pAVar3 = TreeDecomposition::getAttribute
                             ((this->_td).
                              super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,uVar4);
          std::operator+(&local_290," << tuple.",&pAVar3->_name);
          std::operator+(&local_270,&local_290," <<\"|\"");
          std::__cxx11::string::append((string *)&fields);
          std::__cxx11::string::~string((string *)&local_270);
          std::__cxx11::string::~string((string *)&local_290);
        }
      }
      for (uVar4 = 0;
          uVar4 < (ulong)((long)(pVVar2->_aggregates).
                                super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)(pVVar2->_aggregates).
                                super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3); uVar4 = uVar4 + 1) {
        std::__cxx11::to_string(&local_250,uVar4);
        std::operator+(&local_290," << tuple.aggregates[",&local_250);
        std::operator+(&local_270,&local_290,"] << \"|\"");
        std::__cxx11::string::append((string *)&fields);
        std::__cxx11::string::~string((string *)&local_270);
        std::__cxx11::string::~string((string *)&local_290);
        std::__cxx11::string::~string((string *)&local_250);
      }
      std::__cxx11::string::pop_back();
      std::__cxx11::string::pop_back();
      std::__cxx11::string::pop_back();
      offset_abi_cxx11_(&local_b0,this,2);
      std::operator+(&local_90,&local_b0,"for (size_t i=0; i < ");
      std::operator+(&local_70,&local_90,this->viewName + local_2f8);
      std::operator+(&local_190,&local_70,".size(); ++i)\n");
      offset_abi_cxx11_(&local_d0,this,2);
      std::operator+(&local_50,&local_190,&local_d0);
      std::operator+(&local_170,&local_50,"{\n");
      offset_abi_cxx11_(&local_f0,this,3);
      std::operator+(&local_150,&local_170,&local_f0);
      std::operator+(&local_230,&local_150,this->viewName + local_2f8);
      std::operator+(&local_1b0,&local_230,"_tuple& tuple = ");
      std::operator+(&local_210,&local_1b0,this->viewName + local_2f8);
      std::operator+(&local_1f0,&local_210,"[i];\n");
      offset_abi_cxx11_(&local_110,this,3);
      std::operator+(&local_1d0,&local_1f0,&local_110);
      std::operator+(&local_2d0,&local_1d0,"ofs ");
      std::operator+(&local_2b0,&local_2d0,&fields);
      std::operator+(&local_250,&local_2b0,"\"\\n\";\n");
      offset_abi_cxx11_(&local_130,this,2);
      std::operator+(&local_290,&local_250,&local_130);
      std::operator+(&local_270,&local_290,"}\n");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&fields);
    }
    local_2f8 = local_2f8 + 1;
  }
  offset_abi_cxx11_(&local_2b0,this,2);
  std::operator+(&local_250,&local_2b0,"ofs.close();\n");
  offset_abi_cxx11_(&local_2d0,this,1);
  std::operator+(&local_290,&local_250,&local_2d0);
  std::operator+(&local_270,&local_290,"}\n");
  std::operator+(&fields,&local_270,"#endif\n");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&fields);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_2b0);
  return __return_storage_ptr__;
}

Assistant:

std::string CppGenerator::genTestFunction()
{
    std::string returnString = "#ifdef TESTING\n"+
        offset(1)+"void ouputViewsForTesting()\n"+
        offset(1)+"{\n"+offset(2)+"std::ofstream ofs(\"test.out\");\n"+
        offset(2)+"ofs << std::fixed << std::setprecision(2);\n";
    
    for (size_t viewID = 0; viewID < _qc->numberOfViews(); ++viewID)
    {
        View* view = _qc->getView(viewID);

        if (view->_origin != view->_destination)
            continue;

        std::string fields = "";
        for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
        {
            if (view->_fVars[var])
            {
                Attribute* attr = _td->getAttribute(var);
                fields += " << tuple."+attr->_name+" <<\"|\"";
            }
        }

        for (size_t agg = 0; agg < view->_aggregates.size(); ++agg)
            fields += " << tuple.aggregates["+std::to_string(agg)+"] << \"|\"";

        fields.pop_back();
        fields.pop_back();
        fields.pop_back();
        
        returnString += offset(2)+"for (size_t i=0; i < "+viewName[viewID]+
            ".size(); ++i)\n"+offset(2)+"{\n"+offset(3)+
            viewName[viewID]+"_tuple& tuple = "+viewName[viewID]+"[i];\n"+
            offset(3)+"ofs "+fields+"\"\\n\";\n"+offset(2)+"}\n";
    }

    returnString += offset(2)+"ofs.close();\n"+offset(1)+"}\n"+"#endif\n";
    return returnString;
}